

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_class.c
# Opt level: O0

t_gotfn getfn(t_pd *x,t_symbol *s)

{
  t_pd p_Var1;
  int local_3c;
  int i;
  t_methodentry *mlist;
  t_methodentry *m;
  _class *c;
  t_symbol *s_local;
  t_pd *x_local;
  
  p_Var1 = *x;
  mlist = p_Var1->c_methods;
  local_3c = p_Var1->c_nmethod;
  while( true ) {
    if (local_3c == 0) {
      pd_error(x,"%s: no method for message \'%s\'",p_Var1->c_name->s_name,s->s_name);
      return nullfn;
    }
    if (mlist->me_name == s) break;
    mlist = mlist + 1;
    local_3c = local_3c + -1;
  }
  return mlist->me_fun;
}

Assistant:

t_gotfn getfn(const t_pd *x, t_symbol *s)
{
    const t_class *c = *x;
    t_methodentry *m, *mlist;
    int i;

#ifdef PDINSTANCE
    mlist = c->c_methods[pd_this->pd_instanceno];
#else
    mlist = c->c_methods;
#endif
    for (i = c->c_nmethod, m = mlist; i--; m++)
        if (m->me_name == s) return(m->me_fun);
    pd_error(x, "%s: no method for message '%s'", c->c_name->s_name, s->s_name);
    return((t_gotfn)nullfn);
}